

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_utils.c
# Opt level: O0

greatest_test_res file_utils_read_record_2_badfile(void)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  char **local_30;
  char **record_values;
  char **ppcStack_20;
  int field_count;
  char **field_names;
  FILE *fp;
  
  field_names = (char **)fopen("../tests/data/doesntexist.txt","r");
  record_values._4_4_ = read_header((FILE *)field_names,&stack0xffffffffffffffe0);
  if (record_values._4_4_ == 0xffffffff) {
    greatest_info.assertions = greatest_info.assertions + 2;
    iVar1 = read_record((FILE *)field_names,-1,&local_30);
    if (iVar1 == -1) {
      free_cstr_arr(ppcStack_20,(long)(int)record_values._4_4_);
      free_cstr_arr(local_30,(long)(int)record_values._4_4_);
      if (field_names != (char **)0x0) {
        fclose((FILE *)field_names);
      }
      greatest_info.msg = (char *)0x0;
      fp._4_4_ = GREATEST_TEST_RES_PASS;
    }
    else {
      fprintf(_stdout,"\nExpected: ");
      fprintf(_stdout,"%i",0xffffffff);
      fprintf(_stdout,"\n     Got: ");
      __stream = _stdout;
      uVar2 = read_record((FILE *)field_names,record_values._4_4_,&local_30);
      fprintf(__stream,"%i",(ulong)uVar2);
      fprintf(_stdout,"\n");
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
      ;
      greatest_info.fail_line = 0xc1;
      greatest_info.msg = "Somehow read a record from a file that doesn\'t exist";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.assertions = greatest_info.assertions + 1;
    fprintf(_stdout,"\nExpected: ");
    fprintf(_stdout,"%i",0xffffffff);
    fprintf(_stdout,"\n     Got: ");
    fprintf(_stdout,"%i",(ulong)record_values._4_4_);
    fprintf(_stdout,"\n");
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_utils.c"
    ;
    greatest_info.fail_line = 0xbe;
    greatest_info.msg = "Somehow read the header of a nonexisting file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  return fp._4_4_;
}

Assistant:

TEST file_utils_read_record_2_badfile(void) {
    FILE *fp = fopen("../tests/data/doesntexist.txt", "r");

    char **field_names;
    int field_count = read_header(fp, &field_names);

    ASSERT_EQ_FMTm("Somehow read the header of a nonexisting file", -1, field_count, "%i");

    char **record_values;
    ASSERT_EQ_FMTm("Somehow read a record from a file that doesn't exist", -1, read_record(fp, field_count, &record_values), "%i");

    free_cstr_arr(field_names, field_count);
    free_cstr_arr(record_values, field_count); // Free here, because read_record() allocates memory even on read failure.

    if (fp != NULL)
        fclose(fp);

    PASS();
}